

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int skipIfBlock(bool toEndc)

{
  uint uVar1;
  int iVar2;
  IfStack *pIVar3;
  LexerState *pLVar4;
  int iVar5;
  char *fmt;
  byte bVar6;
  int iVar7;
  
  pLVar4 = lexerState;
  lexerState->mode = LEXER_NORMAL;
  pIVar3 = (IfStack *)&pLVar4->ifStack;
  iVar7 = 0;
  do {
    pIVar3 = pIVar3->next;
    iVar7 = iVar7 + 1;
  } while (pIVar3 != (IfStack *)0x0);
  bVar6 = pLVar4->atLineStart;
  pLVar4->disableMacroArgs = true;
  pLVar4->disableInterpolation = true;
  do {
    if ((bVar6 & 1) == 0) goto LAB_0010f47e;
    while ((uVar1 = peek(), uVar1 == 0x20 || (uVar1 == 9))) {
      shiftChar();
    }
    if ((0x19 < (uVar1 & 0xffffffdf) - 0x41) && ((uVar1 != 0x5f && (uVar1 != 0x2e))))
    goto switchD_0010f412_default;
    shiftChar();
    iVar2 = readIdentifier((char)uVar1);
    pLVar4 = lexerState;
    switch(iVar2) {
    case 0x5d:
      lexer_IncIFDepth();
      break;
    case 0x5e:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELIF after an ELSE block\n";
LAB_0010f518:
        fatalerror(fmt);
      }
      goto LAB_0010f454;
    case 0x5f:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELSE after an ELSE block\n";
        goto LAB_0010f518;
      }
      lexerState->ifStack->reachedElseBlock = true;
LAB_0010f454:
      if (!toEndc) {
LAB_0010f458:
        pIVar3 = (IfStack *)&pLVar4->ifStack;
        iVar5 = iVar7;
        do {
          pIVar3 = pIVar3->next;
          iVar5 = iVar5 + -1;
        } while (pIVar3 != (IfStack *)0x0);
        if (iVar5 == 0) {
LAB_0010f4f2:
          pLVar4->disableMacroArgs = false;
          pLVar4->disableInterpolation = false;
          pLVar4->atLineStart = false;
          return iVar2;
        }
        if (iVar2 == 0x60) {
          lexer_DecIFDepth();
        }
      }
      break;
    case 0x60:
      goto LAB_0010f458;
    }
switchD_0010f412_default:
    bVar6 = 0;
LAB_0010f47e:
    do {
      iVar2 = peek();
      if (iVar2 == -1) {
        iVar2 = 0;
        pLVar4 = lexerState;
        goto LAB_0010f4f2;
      }
      shiftChar();
      if ((iVar2 == 10) || (iVar2 == 0xd)) {
        bVar6 = 1;
LAB_0010f4b4:
        if (iVar2 != 10) {
          if (iVar2 != 0xd) goto LAB_0010f4de;
          iVar2 = peek();
          if (iVar2 == 10) {
            shiftChar();
          }
        }
        pLVar4 = lexerState;
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar4->colNo = 1;
      }
      else {
        if (iVar2 != 0x5c) goto LAB_0010f4b4;
        iVar2 = peek();
        if (iVar2 != -1) {
          shiftChar();
          goto LAB_0010f4b4;
        }
      }
LAB_0010f4de:
    } while ((bVar6 & 1) == 0);
  } while( true );
}

Assistant:

static int skipIfBlock(bool toEndc)
{
	lexer_SetMode(LEXER_NORMAL);
	uint32_t startingDepth = lexer_GetIFDepth();
	int token;
	bool atLineStart = lexerState->atLineStart;

	// Prevent expanding macro args and symbol interpolation in this state
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	for (;;) {
		if (atLineStart) {
			int c;

			for (;; shiftChar()) {
				c = peek();
				if (!isWhitespace(c))
					break;
			}

			if (startsIdentifier(c)) {
				shiftChar();
				token = readIdentifier(c);
				switch (token) {
				case T_POP_IF:
					lexer_IncIFDepth();
					break;

				case T_POP_ELIF:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELIF after an ELSE block\n");
					goto maybeFinish;

				case T_POP_ELSE:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELSE after an ELSE block\n");
					lexer_ReachELSEBlock();
					// fallthrough
				maybeFinish:
					if (toEndc) // Ignore ELIF and ELSE, go to ENDC
						break;
					// fallthrough
				case T_POP_ENDC:
					if (lexer_GetIFDepth() == startingDepth)
						goto finish;
					if (token == T_POP_ENDC)
						lexer_DecIFDepth();
				}
			}
			atLineStart = false;
		}

		// Read chars until EOL
		do {
			int c = nextChar();

			if (c == EOF) {
				token = T_EOF;
				goto finish;
			} else if (c == '\\') {
				// Unconditionally skip the next char, including line conts
				c = nextChar();
			} else if (c == '\r' || c == '\n') {
				atLineStart = true;
			}

			if (c == '\r' || c == '\n') {
				// Handle CRLF before nextLine() since shiftChar updates colNo
				handleCRLF(c);
				// Do this both on line continuations and plain EOLs
				nextLine();
			}
		} while (!atLineStart);
	}

finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
	lexerState->atLineStart = false;

	return token;
}